

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<QCss::Symbol>::moveAppend
          (QGenericArrayOps<QCss::Symbol> *this,Symbol *b,Symbol *e)

{
  qsizetype *pqVar1;
  Symbol *pSVar2;
  long lVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  int iVar7;
  
  if ((b != e) && (b < e)) {
    pSVar2 = (this->super_QArrayDataPointer<QCss::Symbol>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<QCss::Symbol>).size;
      pSVar2[lVar3].token = b->token;
      pDVar4 = (b->text).d.d;
      (b->text).d.d = (Data *)0x0;
      pSVar2[lVar3].text.d.d = pDVar4;
      pcVar5 = (b->text).d.ptr;
      (b->text).d.ptr = (char16_t *)0x0;
      pSVar2[lVar3].text.d.ptr = pcVar5;
      qVar6 = (b->text).d.size;
      (b->text).d.size = 0;
      pSVar2[lVar3].text.d.size = qVar6;
      iVar7 = b->len;
      pSVar2[lVar3].start = b->start;
      pSVar2[lVar3].len = iVar7;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<QCss::Symbol>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }